

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::Type::getDefaultValue(ConstantValue *__return_storage_ptr__,Type *this)

{
  ConstantValue *pCVar1;
  
  pCVar1 = (ConstantValue *)
           (*(code *)(&DAT_00424750 +
                     *(int *)(&DAT_00424750 +
                             (ulong)((this->super_Symbol).kind - PredefinedIntegerType) * 4)))();
  return pCVar1;
}

Assistant:

ConstantValue Type::getDefaultValue() const {
    GetDefaultVisitor visitor;
    return visit(visitor);
}